

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_uncompress_block(cram_block *b)

{
  uint local_30;
  uint local_2c;
  uint usize2;
  uint usize;
  size_t uncomp_size;
  char *uncomp;
  cram_block *b_local;
  
  _usize2 = 0;
  if (b->uncomp_size == 0) {
    b->method = RAW;
    return 0;
  }
  uncomp = (char *)b;
  switch(b->method) {
  case RAW:
    b_local._4_4_ = 0;
    break;
  case GZIP:
    uncomp_size = (size_t)zlib_mem_inflate((char *)b->data,(long)b->comp_size,(size_t *)&usize2);
    if ((char *)uncomp_size == (char *)0x0) {
      return -1;
    }
    if ((int)_usize2 != *(int *)(uncomp + 0x14)) {
      free((void *)uncomp_size);
      return -1;
    }
    free(*(void **)(uncomp + 0x20));
    *(size_t *)(uncomp + 0x20) = uncomp_size;
    *(size_t *)(uncomp + 0x28) = _usize2;
    uncomp[0] = '\0';
    uncomp[1] = '\0';
    uncomp[2] = '\0';
    uncomp[3] = '\0';
    goto LAB_001303ba;
  case BZIP2:
    fprintf(_stderr,
            "Bzip2 compression is not compiled into this version.\nPlease rebuild and try again.\n")
    ;
    b_local._4_4_ = -1;
    break;
  case LZMA:
    fprintf(_stderr,
            "Lzma compression is not compiled into this version.\nPlease rebuild and try again.\n");
    b_local._4_4_ = -1;
    break;
  case RANS:
    local_2c = b->uncomp_size;
    uncomp_size = (size_t)rans_uncompress(b->data,b->comp_size,&local_30);
    if (local_2c != local_30) {
      __assert_fail("usize == usize2",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                    ,0x3cb,"int cram_uncompress_block(cram_block *)");
    }
    free(*(void **)(uncomp + 0x20));
    *(size_t *)(uncomp + 0x20) = uncomp_size;
    *(ulong *)(uncomp + 0x28) = (ulong)local_30;
    uncomp[0] = '\0';
    uncomp[1] = '\0';
    uncomp[2] = '\0';
    uncomp[3] = '\0';
    *(uint *)(uncomp + 0x14) = local_30;
LAB_001303ba:
    b_local._4_4_ = 0;
    break;
  default:
    b_local._4_4_ = -1;
  }
  return b_local._4_4_;
}

Assistant:

int cram_uncompress_block(cram_block *b) {
    char *uncomp;
    size_t uncomp_size = 0;

    if (b->uncomp_size == 0) {
	// blank block
	b->method = RAW;
	return 0;
    }

    switch (b->method) {
    case RAW:
	return 0;

    case GZIP:
	uncomp = zlib_mem_inflate((char *)b->data, b->comp_size, &uncomp_size);
	if (!uncomp)
	    return -1;
	if ((int)uncomp_size != b->uncomp_size) {
	    free(uncomp);
	    return -1;
	}
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = uncomp_size;
	b->method = RAW;
	break;

#ifdef HAVE_LIBBZ2
    case BZIP2: {
	unsigned int usize = b->uncomp_size;
	if (!(uncomp = malloc(usize)))
	    return -1;
	if (BZ_OK != BZ2_bzBuffToBuffDecompress(uncomp, &usize,
						(char *)b->data, b->comp_size,
						0, 0)) {
	    free(uncomp);
	    return -1;
	}
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = usize;
	b->method = RAW;
	b->uncomp_size = usize; // Just incase it differs
	break;
    }
#else
    case BZIP2:
	fprintf(stderr, "Bzip2 compression is not compiled into this "
		"version.\nPlease rebuild and try again.\n");
	return -1;
#endif

#ifdef HAVE_LIBLZMA
    case LZMA:
	uncomp = lzma_mem_inflate((char *)b->data, b->comp_size, &uncomp_size);
	if (!uncomp)
	    return -1;
	if ((int)uncomp_size != b->uncomp_size)
	    return -1;
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = uncomp_size;
	b->method = RAW;
	break;
#else
    case LZMA:
	fprintf(stderr, "Lzma compression is not compiled into this "
		"version.\nPlease rebuild and try again.\n");
	return -1;
	break;
#endif

    case RANS: {
	unsigned int usize = b->uncomp_size, usize2;
	uncomp = (char *)rans_uncompress(b->data, b->comp_size, &usize2);
	assert(usize == usize2);
	free(b->data);
	b->data = (unsigned char *)uncomp;
	b->alloc = usize2;
	b->method = RAW;
	b->uncomp_size = usize2; // Just incase it differs
	//fprintf(stderr, "Expanded %d to %d\n", b->comp_size, b->uncomp_size);
	break;
    }

    default:
	return -1;
    }

    return 0;
}